

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O2

void deqp::gles3::Functional::DepthStencilCaseUtil::renderReference
               (vector<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
                *clears,PixelBufferAccess *dstColor,PixelBufferAccess *dstStencil,int stencilBits)

{
  pointer pCVar1;
  uint uVar2;
  int ndx;
  long lVar3;
  long lVar4;
  PixelBufferAccess local_58;
  
  lVar4 = 0x14;
  lVar3 = 0;
  while( true ) {
    pCVar1 = (clears->
             super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(clears->
                     super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0x28) <= lVar3)
    break;
    uVar2 = *(uint *)((long)(pCVar1->color).m_data + lVar4 + -0x18);
    if ((uVar2 >> 0xe & 1) != 0) {
      tcu::getSubregion(&local_58,dstColor,*(int *)((long)(pCVar1->color).m_data + lVar4 + -0x28),
                        *(int *)((long)(pCVar1->color).m_data + lVar4 + -0x24),
                        *(int *)((long)(&pCVar1->color + -2) + lVar4),
                        *(int *)((long)(pCVar1->color).m_data + lVar4 + -0x1c));
      tcu::clear(&local_58,(Vec4 *)((long)(pCVar1->color).m_data + lVar4 + -0x14));
      uVar2 = *(uint *)((long)(pCVar1->color).m_data + lVar4 + -0x18);
    }
    if ((0 < stencilBits) && ((uVar2 & 0x400) != 0)) {
      uVar2 = *(uint *)((long)(pCVar1->color).m_data + lVar4 + -4);
      tcu::getSubregion(&local_58,dstStencil,*(int *)((long)(pCVar1->color).m_data + lVar4 + -0x28),
                        *(int *)((long)(pCVar1->color).m_data + lVar4 + -0x24),
                        *(int *)((long)(&pCVar1->color + -2) + lVar4),
                        *(int *)((long)(pCVar1->color).m_data + lVar4 + -0x1c));
      tcu::clearStencil(&local_58,uVar2 & ~(-1 << ((byte)stencilBits & 0x1f)));
    }
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + 0x28;
  }
  return;
}

Assistant:

void renderReference (const vector<ClearCommand>& clears, const tcu::PixelBufferAccess& dstColor, const tcu::PixelBufferAccess& dstStencil, int stencilBits)
{
	for (int ndx = 0; ndx < (int)clears.size(); ndx++)
	{
		const ClearCommand& clear = clears[ndx];

		if (clear.buffers & GL_COLOR_BUFFER_BIT)
			tcu::clear(tcu::getSubregion(dstColor, clear.rect.left, clear.rect.bottom, clear.rect.width, clear.rect.height), clear.color);

		if (clear.buffers & GL_STENCIL_BUFFER_BIT && stencilBits > 0)
		{
			int maskedVal = clear.stencil & ((1<<stencilBits)-1);
			tcu::clearStencil(tcu::getSubregion(dstStencil, clear.rect.left, clear.rect.bottom, clear.rect.width, clear.rect.height), maskedVal);
		}

		DE_ASSERT(clear.buffers == (clear.buffers & (GL_COLOR_BUFFER_BIT|GL_STENCIL_BUFFER_BIT))); // \note Don't use clear for depths.
	}
}